

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::updatePivots(HEkk *this,HighsInt variable_in,HighsInt row_out,HighsInt move_out)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  u64 *in_RDI;
  double dl_dual_objective_value;
  double vrDual;
  double nwValue;
  HighsInt variable_out;
  value_type in_stack_ffffffffffffff98;
  HighsSimplexAnalysis *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb8;
  HighsInt index;
  value_type vVar5;
  unsigned_long *in_stack_ffffffffffffffe0;
  value_type vVar6;
  
  index = (HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffa0,(HighsInt)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             SUB84(in_stack_ffffffffffffff98,0));
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52f),(long)in_EDX);
  vVar6 = *pvVar2;
  HighsHashHelpers::sparse_inverse_combine(in_RDI,index);
  HighsHashHelpers::sparse_combine(in_RDI,index);
  HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
            ((HighsHashTable<unsigned_long,_void> *)CONCAT44(in_ECX,vVar6),in_stack_ffffffffffffffe0
            );
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52f),(long)in_EDX);
  *pvVar2 = in_ESI;
  pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x532),
                      (long)in_ESI);
  *pvVar3 = '\0';
  pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x535),
                      (long)in_ESI);
  *pvVar3 = '\0';
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4b5),(long)in_ESI);
  vVar5 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c7),(long)in_EDX);
  *pvVar4 = vVar5;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4b8),(long)in_ESI);
  vVar5 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4ca),(long)in_EDX);
  *pvVar4 = vVar5;
  pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x532),
                      (long)vVar6);
  *pvVar3 = '\x01';
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4b5),(long)vVar6);
  dVar1 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4b8),(long)vVar6);
  if ((dVar1 != *pvVar4) || (NAN(dVar1) || NAN(*pvVar4))) {
    if (in_ECX == -1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4b5),(long)vVar6);
      in_stack_ffffffffffffff98 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4be),(long)vVar6);
      *pvVar4 = in_stack_ffffffffffffff98;
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x535),
                          (long)vVar6);
      *pvVar3 = '\x01';
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4b8),(long)vVar6);
      vVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4be),(long)vVar6);
      *pvVar4 = vVar5;
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x535),
                          (long)vVar6);
      *pvVar3 = -1;
    }
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4b5),(long)vVar6);
    in_stack_ffffffffffffffa0 = (HighsSimplexAnalysis *)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4be),(long)vVar6);
    *pvVar4 = (value_type)in_stack_ffffffffffffffa0;
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x535),
                        (long)vVar6);
    *pvVar3 = '\0';
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4be),(long)vVar6);
  vVar5 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4af),(long)vVar6);
  in_RDI[0x52b] = (u64)(vVar5 * *pvVar4 + (double)in_RDI[0x52b]);
  *(int *)((long)in_RDI + 0x2944) = *(int *)((long)in_RDI + 0x2944) + 1;
  if (vVar6 < (int)in_RDI[0x433]) {
    *(int *)(in_RDI + 0x52d) = (int)in_RDI[0x52d] + 1;
  }
  if (in_ESI < (int)in_RDI[0x433]) {
    *(int *)(in_RDI + 0x52d) = (int)in_RDI[0x52d] + -1;
  }
  *(undefined1 *)(in_RDI + 0x4ab) = 0;
  *(undefined1 *)((long)in_RDI + 0x2559) = 0;
  *(undefined1 *)((long)in_RDI + 0x255a) = 0;
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffffa0,(HighsInt)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             SUB84(in_stack_ffffffffffffff98,0));
  return;
}

Assistant:

void HEkk::updatePivots(const HighsInt variable_in, const HighsInt row_out,
                        const HighsInt move_out) {
  analysis_.simplexTimerStart(UpdatePivotsClock);
  HighsInt variable_out = basis_.basicIndex_[row_out];

  // update hash value of basis
  HighsHashHelpers::sparse_inverse_combine(basis_.hash, variable_out);
  HighsHashHelpers::sparse_combine(basis_.hash, variable_in);
  visited_basis_.insert(basis_.hash);

  // Incoming variable
  basis_.basicIndex_[row_out] = variable_in;
  basis_.nonbasicFlag_[variable_in] = 0;
  basis_.nonbasicMove_[variable_in] = 0;
  info_.baseLower_[row_out] = info_.workLower_[variable_in];
  info_.baseUpper_[row_out] = info_.workUpper_[variable_in];

  // Outgoing variable
  basis_.nonbasicFlag_[variable_out] = 1;
  if (info_.workLower_[variable_out] == info_.workUpper_[variable_out]) {
    info_.workValue_[variable_out] = info_.workLower_[variable_out];
    basis_.nonbasicMove_[variable_out] = 0;
  } else if (move_out == -1) {
    info_.workValue_[variable_out] = info_.workLower_[variable_out];
    basis_.nonbasicMove_[variable_out] = 1;
  } else {
    info_.workValue_[variable_out] = info_.workUpper_[variable_out];
    basis_.nonbasicMove_[variable_out] = -1;
  }
  // Update the dual objective value
  double nwValue = info_.workValue_[variable_out];
  double vrDual = info_.workDual_[variable_out];
  double dl_dual_objective_value = nwValue * vrDual;
  info_.updated_dual_objective_value += dl_dual_objective_value;
  info_.update_count++;
  // Update the number of basic logicals
  if (variable_out < lp_.num_col_) info_.num_basic_logicals++;
  if (variable_in < lp_.num_col_) info_.num_basic_logicals--;
  // No longer have a representation of B^{-1}, and certainly not
  // fresh!
  status_.has_invert = false;
  status_.has_fresh_invert = false;
  // Data are no longer fresh from rebuild
  status_.has_fresh_rebuild = false;
  analysis_.simplexTimerStop(UpdatePivotsClock);
}